

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall re2::RE2::PossibleMatchRange(RE2 *this,string *min,string *max,int maxlen)

{
  char cVar1;
  pointer pcVar2;
  string *this_00;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  string dmin;
  string dmax;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string local_50;
  
  if (this->prog_ != (Prog *)0x0) {
    uVar6 = (uint)(this->prefix_)._M_string_length;
    if (maxlen <= (int)uVar6) {
      uVar6 = maxlen;
    }
    uVar5 = 0;
    local_58 = max;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,&this->prefix_,0,(long)(int)uVar6);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (min,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = local_58;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,&this->prefix_,0,(long)(int)uVar6);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (*(int *)&this->field_0x44 < 0) {
      uVar4 = 0;
      if (0 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        pcVar2 = (min->_M_dataplus)._M_p;
        cVar1 = pcVar2[uVar5];
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          pcVar2[uVar5] = cVar1 + -0x20;
        }
      }
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_50.field_2._M_local_buf[0] = '\0';
    if ((maxlen - uVar6 == 0 || maxlen < (int)uVar6) ||
       (bVar3 = Prog::PossibleMatchRange(this->prog_,(string *)&local_78,&local_50,maxlen - uVar6),
       !bVar3)) {
      if (this_00->_M_string_length == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (min,"");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (this_00,"");
        bVar3 = false;
      }
      else {
        bVar3 = true;
        PrefixSuccessor((string *)this_00);
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)min,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
      bVar3 = true;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    return bVar3;
  }
  return false;
}

Assistant:

bool RE2::PossibleMatchRange(std::string* min, std::string* max,
                             int maxlen) const {
  if (prog_ == NULL)
    return false;

  int n = static_cast<int>(prefix_.size());
  if (n > maxlen)
    n = maxlen;

  // Determine initial min max from prefix_ literal.
  *min = prefix_.substr(0, n);
  *max = prefix_.substr(0, n);
  if (prefix_foldcase_) {
    // prefix is ASCII lowercase; change *min to uppercase.
    for (int i = 0; i < n; i++) {
      char& c = (*min)[i];
      if ('a' <= c && c <= 'z')
        c += 'A' - 'a';
    }
  }

  // Add to prefix min max using PossibleMatchRange on regexp.
  std::string dmin, dmax;
  maxlen -= n;
  if (maxlen > 0 && prog_->PossibleMatchRange(&dmin, &dmax, maxlen)) {
    min->append(dmin);
    max->append(dmax);
  } else if (!max->empty()) {
    // prog_->PossibleMatchRange has failed us,
    // but we still have useful information from prefix_.
    // Round up *max to allow any possible suffix.
    PrefixSuccessor(max);
  } else {
    // Nothing useful.
    *min = "";
    *max = "";
    return false;
  }

  return true;
}